

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_valid(void)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  xmlDocPtr pxVar41;
  xmlBufferPtr pxVar42;
  xmlAttrPtr pxVar43;
  xmlNodePtr pxVar44;
  xmlDocPtr pxVar45;
  xmlDocPtr pxVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int nr;
  int nr_00;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  int extraout_EDX_31;
  int extraout_EDX_32;
  int extraout_EDX_33;
  int extraout_EDX_34;
  int extraout_EDX_35;
  int extraout_EDX_36;
  int test_ret_2;
  undefined8 *puVar49;
  xmlNodePtr pxVar50;
  bool bVar51;
  int n_defaultValue;
  uint uVar52;
  int iVar53;
  xmlDtdPtr in_RSI;
  xmlNs *pxVar54;
  undefined4 uVar55;
  undefined8 uVar56;
  int n_name;
  xmlDtdPtr pxVar57;
  undefined8 uVar58;
  int test_ret_1;
  undefined4 *puVar59;
  int test_ret_43;
  int n_dtd;
  uint uVar60;
  undefined1 auVar61 [12];
  int test_ret_4;
  int test_ret_5;
  int test_ret;
  int test_ret_7;
  int test_ret_19;
  int test_ret_8;
  int test_ret_11;
  int test_ret_18;
  int test_ret_16;
  int test_ret_37;
  uint local_38;
  int test_ret_38;
  
  if (quiet == '\0') {
    puts("Testing valid : 50 of 70 functions ...");
  }
  local_38 = 0;
  test_ret_37 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar60 = 0;
    do {
      uVar10 = 0;
      do {
        uVar9 = 0;
        do {
          uVar8 = 0;
          do {
            uVar38 = 0;
            do {
              uVar3 = (int)uVar38 - 1;
              uVar39 = 0;
              do {
                uVar4 = (int)uVar39 - 1;
                puVar49 = &DAT_00162d68;
                uVar52 = 0;
                do {
                  iVar7 = (int)in_RSI;
                  iVar5 = xmlMemBlocks();
                  if (bVar51) {
                    lVar40 = xmlNewValidCtxt();
                  }
                  else {
                    lVar40 = 0;
                  }
                  in_RSI = gen_xmlDtdPtr(uVar60,iVar7);
                  if (uVar10 < 4) {
                    uVar58 = (&DAT_00162d68)[uVar10];
                  }
                  else {
                    uVar58 = 0;
                  }
                  if (uVar9 < 4) {
                    uVar47 = (&DAT_00162d68)[uVar9];
                  }
                  else {
                    uVar47 = 0;
                  }
                  if (uVar8 < 4) {
                    uVar48 = (&DAT_00162d68)[uVar8];
                  }
                  else {
                    uVar48 = 0;
                  }
                  uVar6 = 0;
                  uVar55 = 0;
                  if (uVar3 < 3) {
                    uVar55 = *(undefined4 *)(&DAT_0015221c + (ulong)uVar3 * 4);
                  }
                  if (uVar4 < 3) {
                    uVar6 = *(undefined4 *)(&DAT_00152204 + (ulong)uVar4 * 4);
                  }
                  if (uVar52 < 4) {
                    uVar56 = *puVar49;
                  }
                  else {
                    uVar56 = 0;
                  }
                  auVar61 = xmlAddAttributeDecl(lVar40,in_RSI,uVar58,uVar47,uVar48,uVar55,uVar6,
                                                uVar56,0);
                  iVar7 = auVar61._8_4_;
                  if (auVar61._0_8_ != 0) {
                    xmlUnlinkNode(auVar61._0_8_);
                    iVar7 = extraout_EDX;
                  }
                  call_tests = call_tests + 1;
                  if (lVar40 != 0) {
                    xmlFreeValidCtxt(lVar40);
                    iVar7 = extraout_EDX_00;
                  }
                  des_xmlDtdPtr(uVar60,in_RSI,iVar7);
                  xmlResetLastError();
                  iVar7 = xmlMemBlocks();
                  if (iVar5 != iVar7) {
                    iVar7 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlAddAttributeDecl",
                           (ulong)(uint)(iVar7 - iVar5));
                    local_38 = local_38 + 1;
                    printf(" %d",(ulong)(uint)test_ret_37);
                    printf(" %d",(ulong)uVar60);
                    printf(" %d",(ulong)uVar10);
                    printf(" %d",(ulong)uVar9);
                    printf(" %d",(ulong)uVar8);
                    printf(" %d",uVar38);
                    printf(" %d",uVar39);
                    printf(" %d");
                    in_RSI = (xmlDtdPtr)0x0;
                    printf(" %d");
                    putchar(10);
                  }
                  uVar52 = uVar52 + 1;
                  puVar49 = puVar49 + 1;
                } while (uVar52 != 5);
                uVar4 = (int)uVar39 + 1;
                uVar39 = (ulong)uVar4;
              } while (uVar4 != 4);
              uVar3 = (int)uVar38 + 1;
              uVar38 = (ulong)uVar3;
            } while (uVar3 != 4);
            uVar8 = uVar8 + 1;
          } while (uVar8 != 5);
          uVar9 = uVar9 + 1;
        } while (uVar9 != 5);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 5);
      uVar60 = uVar60 + 1;
    } while (uVar60 != 3);
    test_ret_37 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  test_ret = 0;
  _test_ret_5 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar60 = 0;
    do {
      uVar38 = 0;
      do {
        uVar10 = 0xffffffff;
        do {
          iVar7 = (int)in_RSI;
          iVar5 = xmlMemBlocks();
          if (bVar51) {
            lVar40 = xmlNewValidCtxt();
          }
          else {
            lVar40 = 0;
          }
          in_RSI = gen_xmlDtdPtr(uVar60,iVar7);
          if ((uint)uVar38 < 4) {
            uVar58 = (&DAT_00162d68)[uVar38];
          }
          else {
            uVar58 = 0;
          }
          uVar55 = 0;
          if (uVar10 < 3) {
            uVar55 = (&DAT_00152210)[uVar10];
          }
          auVar61 = xmlAddElementDecl(lVar40,in_RSI,uVar58,uVar55,0);
          iVar7 = auVar61._8_4_;
          if (auVar61._0_8_ != 0) {
            xmlUnlinkNode(auVar61._0_8_);
            iVar7 = extraout_EDX_01;
          }
          call_tests = call_tests + 1;
          if (lVar40 != 0) {
            xmlFreeValidCtxt(lVar40);
            iVar7 = extraout_EDX_02;
          }
          uVar10 = uVar10 + 1;
          des_xmlDtdPtr(uVar60,in_RSI,iVar7);
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar5 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlAddElementDecl",(ulong)(uint)(iVar7 - iVar5));
            test_ret = test_ret + 1;
            printf(" %d",_test_ret_5);
            printf(" %d",(ulong)uVar60);
            printf(" %d",uVar38);
            printf(" %d");
            in_RSI = (xmlDtdPtr)0x0;
            printf(" %d");
            putchar(10);
          }
        } while (uVar10 != 3);
        uVar10 = (uint)uVar38 + 1;
        uVar38 = (ulong)uVar10;
      } while (uVar10 != 5);
      uVar60 = uVar60 + 1;
    } while (uVar60 != 3);
    _test_ret_5 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar7 = 0;
  iVar5 = 0;
  do {
    iVar12 = (int)in_RSI;
    iVar11 = xmlMemBlocks();
    pxVar41 = gen_xmlDocPtr(iVar5,iVar12);
    in_RSI = (xmlDtdPtr)0x0;
    lVar40 = xmlCopyDocElementContent(pxVar41);
    if (lVar40 != 0) {
      xmlFreeElementContent(lVar40);
    }
    call_tests = call_tests + 1;
    if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
      xmlFreeDoc(pxVar41);
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyDocElementContent",(ulong)(uint)(iVar12 - iVar11));
      iVar7 = iVar7 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 4);
  function_tests = function_tests + 1;
  iVar5 = xmlMemBlocks();
  lVar40 = xmlCopyElementContent(0);
  if (lVar40 != 0) {
    xmlFreeElementContent(lVar40);
  }
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar5 != iVar11) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlCopyElementContent");
    in_RSI = (xmlDtdPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar12 = 0;
  iVar53 = 0;
  do {
    iVar14 = (int)in_RSI;
    iVar13 = xmlMemBlocks();
    pxVar42 = gen_xmlBufferPtr(iVar53,iVar14);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpAttributeDecl(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar42);
    }
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpAttributeDecl",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar53 = iVar53 + 1;
  } while (iVar53 != 3);
  function_tests = function_tests + 1;
  iVar13 = 0;
  iVar53 = 0;
  do {
    iVar15 = (int)in_RSI;
    iVar14 = xmlMemBlocks();
    pxVar42 = gen_xmlBufferPtr(iVar53,iVar15);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpAttributeTable(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar42);
    }
    xmlResetLastError();
    iVar15 = xmlMemBlocks();
    if (iVar14 != iVar15) {
      iVar15 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpAttributeTable",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar53 = iVar53 + 1;
  } while (iVar53 != 3);
  function_tests = function_tests + 1;
  iVar53 = 0;
  iVar14 = 0;
  do {
    iVar16 = (int)in_RSI;
    iVar15 = xmlMemBlocks();
    pxVar42 = gen_xmlBufferPtr(iVar14,iVar16);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpElementDecl(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar42);
    }
    xmlResetLastError();
    iVar16 = xmlMemBlocks();
    if (iVar15 != iVar16) {
      iVar16 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpElementDecl",(ulong)(uint)(iVar16 - iVar15));
      iVar53 = iVar53 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar14 = iVar14 + 1;
  } while (iVar14 != 3);
  function_tests = function_tests + 1;
  iVar14 = 0;
  iVar15 = 0;
  do {
    iVar17 = (int)in_RSI;
    iVar16 = xmlMemBlocks();
    pxVar42 = gen_xmlBufferPtr(iVar15,iVar17);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpElementTable(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar42);
    }
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar16 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpElementTable",(ulong)(uint)(iVar17 - iVar16));
      iVar14 = iVar14 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar15 = iVar15 + 1;
  } while (iVar15 != 3);
  function_tests = function_tests + 1;
  iVar15 = 0;
  iVar16 = 0;
  do {
    iVar18 = (int)in_RSI;
    iVar17 = xmlMemBlocks();
    pxVar42 = gen_xmlBufferPtr(iVar16,iVar18);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpNotationDecl(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar42);
    }
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpNotationDecl",(ulong)(uint)(iVar18 - iVar17));
      iVar15 = iVar15 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 != 3);
  function_tests = function_tests + 1;
  iVar16 = 0;
  iVar17 = 0;
  do {
    iVar19 = (int)in_RSI;
    iVar18 = xmlMemBlocks();
    pxVar42 = gen_xmlBufferPtr(iVar17,iVar19);
    in_RSI = (xmlDtdPtr)0x0;
    xmlDumpNotationTable(pxVar42);
    call_tests = call_tests + 1;
    if (pxVar42 != (xmlBufferPtr)0x0) {
      xmlBufferFree(pxVar42);
    }
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlDumpNotationTable",(ulong)(uint)(iVar19 - iVar18));
      iVar16 = iVar16 + 1;
      printf(" %d");
      in_RSI = (xmlDtdPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar17 = iVar17 + 1;
  } while (iVar17 != 3);
  function_tests = function_tests + 1;
  iVar17 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0;
    do {
      pxVar57 = (xmlDtdPtr)0x0;
      puVar49 = &DAT_00162d68;
      do {
        iVar19 = (int)in_RSI;
        iVar18 = xmlMemBlocks();
        in_RSI = gen_xmlDtdPtr(uVar60,iVar19);
        if (uVar10 < 4) {
          uVar58 = (&DAT_00162d68)[uVar10];
        }
        else {
          uVar58 = 0;
        }
        uVar9 = (uint)pxVar57;
        if (uVar9 < 4) {
          uVar47 = *puVar49;
        }
        else {
          uVar47 = 0;
        }
        auVar61 = xmlGetDtdAttrDesc(in_RSI,uVar58,uVar47);
        iVar19 = auVar61._8_4_;
        if (auVar61._0_8_ != 0) {
          xmlUnlinkNode(auVar61._0_8_);
          iVar19 = extraout_EDX_03;
        }
        call_tests = call_tests + 1;
        des_xmlDtdPtr(uVar60,in_RSI,iVar19);
        xmlResetLastError();
        iVar19 = xmlMemBlocks();
        if (iVar18 != iVar19) {
          iVar19 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlGetDtdAttrDesc",(ulong)(uint)(iVar19 - iVar18));
          iVar17 = iVar17 + 1;
          printf(" %d",(ulong)uVar60);
          printf(" %d",(ulong)uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar57;
        }
        uVar9 = uVar9 + 1;
        pxVar57 = (xmlDtdPtr)(ulong)uVar9;
        puVar49 = puVar49 + 1;
      } while (uVar9 != 5);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 5);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 3);
  function_tests = function_tests + 1;
  iVar18 = 0;
  uVar60 = 0;
  do {
    puVar49 = &DAT_00162d68;
    uVar10 = 0;
    do {
      iVar20 = (int)in_RSI;
      iVar19 = xmlMemBlocks();
      in_RSI = gen_xmlDtdPtr(uVar60,iVar20);
      if (uVar10 < 4) {
        uVar58 = *puVar49;
      }
      else {
        uVar58 = 0;
      }
      auVar61 = xmlGetDtdElementDesc(in_RSI,uVar58);
      iVar20 = auVar61._8_4_;
      if (auVar61._0_8_ != 0) {
        xmlUnlinkNode(auVar61._0_8_);
        iVar20 = extraout_EDX_04;
      }
      call_tests = call_tests + 1;
      des_xmlDtdPtr(uVar60,in_RSI,iVar20);
      xmlResetLastError();
      iVar20 = xmlMemBlocks();
      if (iVar19 != iVar20) {
        iVar20 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetDtdElementDesc",(ulong)(uint)(iVar20 - iVar19));
        iVar18 = iVar18 + 1;
        printf(" %d",(ulong)uVar60);
        in_RSI = (xmlDtdPtr)(ulong)uVar10;
        printf(" %d");
        putchar(10);
      }
      uVar10 = uVar10 + 1;
      puVar49 = puVar49 + 1;
    } while (uVar10 != 5);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 3);
  function_tests = function_tests + 1;
  iVar19 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0;
    do {
      uVar38 = 0;
      do {
        puVar49 = &DAT_00162d68;
        pxVar57 = (xmlDtdPtr)0x0;
        do {
          iVar21 = (int)in_RSI;
          iVar20 = xmlMemBlocks();
          in_RSI = gen_xmlDtdPtr(uVar60,iVar21);
          if (uVar10 < 4) {
            uVar58 = (&DAT_00162d68)[uVar10];
          }
          else {
            uVar58 = 0;
          }
          if ((uint)uVar38 < 4) {
            uVar47 = (&DAT_00162d68)[uVar38];
          }
          else {
            uVar47 = 0;
          }
          uVar9 = (uint)pxVar57;
          if (uVar9 < 4) {
            uVar48 = *puVar49;
          }
          else {
            uVar48 = 0;
          }
          auVar61 = xmlGetDtdQAttrDesc(in_RSI,uVar58,uVar47,uVar48);
          iVar21 = auVar61._8_4_;
          if (auVar61._0_8_ != 0) {
            xmlUnlinkNode(auVar61._0_8_);
            iVar21 = extraout_EDX_05;
          }
          call_tests = call_tests + 1;
          des_xmlDtdPtr(uVar60,in_RSI,iVar21);
          xmlResetLastError();
          iVar21 = xmlMemBlocks();
          if (iVar20 != iVar21) {
            iVar21 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlGetDtdQAttrDesc",(ulong)(uint)(iVar21 - iVar20));
            iVar19 = iVar19 + 1;
            printf(" %d",(ulong)uVar60);
            printf(" %d",(ulong)uVar10);
            printf(" %d",uVar38);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar57;
          }
          uVar9 = uVar9 + 1;
          pxVar57 = (xmlDtdPtr)(ulong)uVar9;
          puVar49 = puVar49 + 1;
        } while (uVar9 != 5);
        uVar9 = (uint)uVar38 + 1;
        uVar38 = (ulong)uVar9;
      } while (uVar9 != 5);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 5);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 3);
  function_tests = function_tests + 1;
  iVar20 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0;
    do {
      pxVar57 = (xmlDtdPtr)0x0;
      puVar49 = &DAT_00162d68;
      do {
        iVar22 = (int)in_RSI;
        iVar21 = xmlMemBlocks();
        in_RSI = gen_xmlDtdPtr(uVar60,iVar22);
        if (uVar10 < 4) {
          uVar58 = (&DAT_00162d68)[uVar10];
        }
        else {
          uVar58 = 0;
        }
        uVar9 = (uint)pxVar57;
        if (uVar9 < 4) {
          uVar47 = *puVar49;
        }
        else {
          uVar47 = 0;
        }
        auVar61 = xmlGetDtdQElementDesc(in_RSI,uVar58,uVar47);
        iVar22 = auVar61._8_4_;
        if (auVar61._0_8_ != 0) {
          xmlUnlinkNode(auVar61._0_8_);
          iVar22 = extraout_EDX_06;
        }
        call_tests = call_tests + 1;
        des_xmlDtdPtr(uVar60,in_RSI,iVar22);
        xmlResetLastError();
        iVar22 = xmlMemBlocks();
        if (iVar21 != iVar22) {
          iVar22 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlGetDtdQElementDesc",(ulong)(uint)(iVar22 - iVar21));
          iVar20 = iVar20 + 1;
          printf(" %d",(ulong)uVar60);
          printf(" %d",(ulong)uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar57;
        }
        uVar9 = uVar9 + 1;
        pxVar57 = (xmlDtdPtr)(ulong)uVar9;
        puVar49 = puVar49 + 1;
      } while (uVar9 != 5);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 5);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 3);
  function_tests = function_tests + 1;
  iVar21 = 0;
  uVar60 = 0;
  do {
    puVar49 = &DAT_00162d68;
    uVar10 = 0;
    do {
      iVar23 = (int)in_RSI;
      iVar22 = xmlMemBlocks();
      pxVar41 = gen_xmlDocPtr(uVar60,iVar23);
      if (uVar10 < 4) {
        in_RSI = (xmlDtdPtr)*puVar49;
      }
      else {
        in_RSI = (xmlDtdPtr)0x0;
      }
      lVar40 = xmlGetID(pxVar41);
      if (lVar40 != 0) {
        xmlUnlinkNode(lVar40);
        xmlFreeNode(lVar40);
      }
      call_tests = call_tests + 1;
      if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
        xmlFreeDoc(pxVar41);
      }
      xmlResetLastError();
      iVar23 = xmlMemBlocks();
      if (iVar22 != iVar23) {
        iVar23 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetID",(ulong)(uint)(iVar23 - iVar22));
        iVar21 = iVar21 + 1;
        printf(" %d",(ulong)uVar60);
        in_RSI = (xmlDtdPtr)(ulong)uVar10;
        printf(" %d");
        putchar(10);
      }
      uVar10 = uVar10 + 1;
      puVar49 = puVar49 + 1;
    } while (uVar10 != 5);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 4);
  function_tests = function_tests + 1;
  iVar22 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0;
    do {
      pxVar57 = (xmlDtdPtr)0x0;
      bVar2 = true;
      do {
        bVar51 = bVar2;
        iVar23 = (int)in_RSI;
        iVar24 = xmlMemBlocks();
        pxVar41 = gen_xmlDocPtr(uVar60,iVar23);
        in_RSI = (xmlDtdPtr)gen_xmlNodePtr(uVar10,iVar23);
        pxVar43 = gen_xmlAttrPtr((int)pxVar57,iVar23);
        xmlIsID(pxVar41,in_RSI,pxVar43);
        call_tests = call_tests + 1;
        iVar23 = extraout_EDX_07;
        if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
          xmlFreeDoc(pxVar41);
          iVar23 = extraout_EDX_08;
        }
        des_xmlNodePtr(uVar10,(xmlNodePtr)in_RSI,iVar23);
        if (bVar51) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar23 = xmlMemBlocks();
        if (iVar24 != iVar23) {
          iVar23 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsID",(ulong)(uint)(iVar23 - iVar24));
          iVar22 = iVar22 + 1;
          printf(" %d",(ulong)uVar60);
          printf(" %d",(ulong)uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar57;
        }
        pxVar57 = (xmlDtdPtr)0x1;
        bVar2 = false;
      } while (bVar51);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 3);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 4);
  function_tests = function_tests + 1;
  iVar23 = 0;
  uVar60 = 0;
  do {
    puVar49 = &DAT_00162d68;
    uVar10 = 0;
    do {
      iVar25 = (int)in_RSI;
      iVar24 = xmlMemBlocks();
      pxVar41 = gen_xmlDocPtr(uVar60,iVar25);
      if (uVar10 < 4) {
        in_RSI = (xmlDtdPtr)*puVar49;
      }
      else {
        in_RSI = (xmlDtdPtr)0x0;
      }
      xmlIsMixedElement(pxVar41);
      call_tests = call_tests + 1;
      if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
        xmlFreeDoc(pxVar41);
      }
      xmlResetLastError();
      iVar25 = xmlMemBlocks();
      if (iVar24 != iVar25) {
        iVar25 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIsMixedElement",(ulong)(uint)(iVar25 - iVar24));
        iVar23 = iVar23 + 1;
        printf(" %d",(ulong)uVar60);
        in_RSI = (xmlDtdPtr)(ulong)uVar10;
        printf(" %d");
        putchar(10);
      }
      uVar10 = uVar10 + 1;
      puVar49 = puVar49 + 1;
    } while (uVar10 != 5);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 4);
  function_tests = function_tests + 1;
  iVar24 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0;
    do {
      pxVar57 = (xmlDtdPtr)0x0;
      bVar2 = true;
      do {
        bVar51 = bVar2;
        iVar25 = (int)in_RSI;
        iVar26 = xmlMemBlocks();
        pxVar41 = gen_xmlDocPtr(uVar60,iVar25);
        in_RSI = (xmlDtdPtr)gen_xmlNodePtr(uVar10,iVar25);
        pxVar43 = gen_xmlAttrPtr((int)pxVar57,iVar25);
        xmlIsRef(pxVar41,in_RSI,pxVar43);
        call_tests = call_tests + 1;
        iVar25 = extraout_EDX_09;
        if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
          xmlFreeDoc(pxVar41);
          iVar25 = extraout_EDX_10;
        }
        des_xmlNodePtr(uVar10,(xmlNodePtr)in_RSI,iVar25);
        if (bVar51) {
          xmlFreeDoc(api_doc);
          api_doc = (xmlDocPtr)0x0;
          api_dtd = (xmlDtdPtr)0x0;
          api_root = (xmlNodePtr)0x0;
          api_ns = (xmlNsPtr)0x0;
        }
        xmlResetLastError();
        iVar25 = xmlMemBlocks();
        if (iVar26 != iVar25) {
          iVar25 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlIsRef",(ulong)(uint)(iVar25 - iVar26));
          iVar24 = iVar24 + 1;
          printf(" %d",(ulong)uVar60);
          printf(" %d",(ulong)uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar57;
        }
        pxVar57 = (xmlDtdPtr)0x1;
        bVar2 = false;
      } while (bVar51);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 3);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 4);
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0;
    do {
      uVar9 = 0xffffffff;
      do {
        iVar26 = (int)in_RSI;
        iVar25 = xmlMemBlocks();
        pxVar41 = gen_xmlDocPtr(uVar60,iVar26);
        if (uVar10 < 4) {
          uVar58 = (&DAT_00162d68)[uVar10];
        }
        else {
          uVar58 = 0;
        }
        uVar55 = 0;
        if (uVar9 < 3) {
          uVar55 = (&DAT_00152210)[uVar9];
        }
        in_RSI = (xmlDtdPtr)xmlNewDocElementContent(pxVar41,uVar58,uVar55);
        xmlFreeDocElementContent(pxVar41);
        call_tests = call_tests + 1;
        if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
          xmlFreeDoc(pxVar41);
        }
        uVar9 = uVar9 + 1;
        xmlResetLastError();
        iVar26 = xmlMemBlocks();
        if (iVar25 != iVar26) {
          iVar26 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocElementContent",(ulong)(uint)(iVar26 - iVar25)
                );
          test_ret_4 = test_ret_4 + 1;
          printf(" %d",(ulong)uVar60);
          printf(" %d",(ulong)uVar10);
          in_RSI = (xmlDtdPtr)(ulong)uVar9;
          printf(" %d");
          putchar(10);
        }
      } while (uVar9 != 3);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 5);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 4);
  function_tests = function_tests + 1;
  iVar25 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0xffffffff;
    do {
      iVar26 = xmlMemBlocks();
      if (uVar60 < 4) {
        uVar58 = (&DAT_00162d68)[uVar60];
      }
      else {
        uVar58 = 0;
      }
      pxVar43 = (xmlAttrPtr)0x0;
      if (uVar10 < 3) {
        pxVar43 = (xmlAttrPtr)(ulong)(uint)(&DAT_00152210)[uVar10];
      }
      lVar40 = xmlNewElementContent(uVar58);
      if (lVar40 != 0) {
        xmlFreeElementContent();
      }
      uVar10 = uVar10 + 1;
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar27 = xmlMemBlocks();
      if (iVar26 != iVar27) {
        iVar27 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewElementContent",(ulong)(uint)(iVar27 - iVar26));
        iVar25 = iVar25 + 1;
        printf(" %d",(ulong)uVar60);
        pxVar43 = (xmlAttrPtr)(ulong)uVar10;
        printf(" %d");
        putchar(10);
      }
    } while (uVar10 != 3);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 5);
  function_tests = function_tests + 1;
  iVar26 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0;
    bVar2 = true;
    do {
      bVar51 = bVar2;
      iVar28 = (int)pxVar43;
      iVar27 = xmlMemBlocks();
      pxVar41 = gen_xmlDocPtr(uVar60,iVar28);
      pxVar43 = gen_xmlAttrPtr(uVar10,iVar28);
      xmlRemoveID(pxVar41);
      call_tests = call_tests + 1;
      if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
        xmlFreeDoc(pxVar41);
      }
      if (bVar51) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar28 = xmlMemBlocks();
      if (iVar27 != iVar28) {
        iVar28 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRemoveID",(ulong)(uint)(iVar28 - iVar27));
        iVar26 = iVar26 + 1;
        printf(" %d",(ulong)uVar60);
        pxVar43 = (xmlAttrPtr)(ulong)uVar10;
        printf(" %d");
        putchar(10);
      }
      uVar10 = 1;
      bVar2 = false;
    } while (bVar51);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 4);
  iVar5 = test_ret + local_38 + iVar7 + (uint)(iVar5 != iVar11) + iVar12 + iVar13 + iVar53 + iVar14
          + iVar15 + iVar16 + iVar17 + iVar18 + iVar19 + iVar20 + iVar21 + iVar22 + iVar23 + iVar24
          + test_ret_4;
  function_tests = function_tests + 1;
  test_ret_4 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0;
    bVar2 = true;
    do {
      bVar51 = bVar2;
      iVar11 = (int)pxVar43;
      iVar7 = xmlMemBlocks();
      pxVar41 = gen_xmlDocPtr(uVar60,iVar11);
      pxVar43 = gen_xmlAttrPtr(uVar10,iVar11);
      xmlRemoveRef(pxVar41);
      call_tests = call_tests + 1;
      if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
        xmlFreeDoc(pxVar41);
      }
      if (bVar51) {
        xmlFreeDoc(api_doc);
        api_doc = (xmlDocPtr)0x0;
        api_dtd = (xmlDtdPtr)0x0;
        api_root = (xmlNodePtr)0x0;
        api_ns = (xmlNsPtr)0x0;
      }
      xmlResetLastError();
      iVar11 = xmlMemBlocks();
      if (iVar7 != iVar11) {
        iVar11 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRemoveRef",(ulong)(uint)(iVar11 - iVar7));
        test_ret_4 = test_ret_4 + 1;
        printf(" %d",(ulong)uVar60);
        pxVar43 = (xmlAttrPtr)(ulong)uVar10;
        printf(" %d");
        putchar(10);
      }
      uVar10 = 1;
      bVar2 = false;
    } while (bVar51);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 4);
  function_tests = function_tests + 1;
  iVar26 = iVar26 + test_ret_4;
  iVar7 = 0;
  uVar60 = 0;
  do {
    puVar59 = &DAT_0015fd14;
    iVar11 = 0;
    do {
      iVar12 = xmlMemBlocks();
      uVar55 = 0xffffffff;
      if (uVar60 < 4) {
        uVar55 = (&DAT_0015fd14)[uVar60];
      }
      xmlSnprintfElementContent(0,uVar55,0,*puVar59);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar53 = xmlMemBlocks();
      if (iVar12 != iVar53) {
        iVar53 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSnprintfElementContent",(ulong)(uint)(iVar53 - iVar12)
              );
        iVar7 = iVar7 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar60);
        printf(" %d",0);
        printf(" %d");
        putchar(10);
      }
      iVar11 = iVar11 + 1;
      puVar59 = puVar59 + 1;
    } while (iVar11 != 4);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 4);
  function_tests = function_tests + 1;
  puVar59 = &DAT_0015fd14;
  iVar12 = 0;
  iVar11 = 0;
  do {
    iVar53 = xmlMemBlocks();
    xmlSprintfElementContent(0,0,*puVar59);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar53 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSprintfElementContent",(ulong)(uint)(iVar13 - iVar53));
      iVar11 = iVar11 + 1;
      printf(" %d",0);
      printf(" %d",0);
      printf(" %d");
      putchar(10);
    }
    iVar12 = iVar12 + 1;
    puVar59 = puVar59 + 1;
  } while (iVar12 != 4);
  function_tests = function_tests + 1;
  test_ret_19 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    iVar12 = xmlMemBlocks();
    if (bVar51) {
      lVar40 = xmlNewValidCtxt();
    }
    else {
      lVar40 = 0;
    }
    pxVar44 = (xmlNodePtr)0x0;
    xmlValidBuildContentModel(lVar40);
    call_tests = call_tests + 1;
    if (lVar40 != 0) {
      xmlFreeValidCtxt(lVar40);
    }
    xmlResetLastError();
    iVar53 = xmlMemBlocks();
    if (iVar12 != iVar53) {
      iVar53 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlValidBuildContentModel",(ulong)(uint)(iVar53 - iVar12));
      test_ret_19 = test_ret_19 + 1;
      printf(" %d");
      pxVar44 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar12 = 0;
  _test_ret_8 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    test_ret = 0;
    do {
      iVar53 = 0;
      do {
        uVar38 = 0;
        do {
          puVar49 = &DAT_00162d68;
          pxVar50 = (xmlNodePtr)0x0;
          do {
            iVar14 = (int)pxVar44;
            iVar13 = xmlMemBlocks();
            if (bVar51) {
              lVar40 = xmlNewValidCtxt();
            }
            else {
              lVar40 = 0;
            }
            pxVar41 = gen_xmlDocPtr(test_ret,iVar14);
            pxVar44 = gen_xmlNodePtr(iVar53,iVar14);
            if ((uint)uVar38 < 4) {
              uVar58 = (&DAT_00162d68)[uVar38];
            }
            else {
              uVar58 = 0;
            }
            uVar60 = (uint)pxVar50;
            if (uVar60 < 4) {
              uVar47 = *puVar49;
            }
            else {
              uVar47 = 0;
            }
            auVar61 = xmlValidCtxtNormalizeAttributeValue(lVar40,pxVar41,pxVar44,uVar58,uVar47);
            iVar14 = auVar61._8_4_;
            if (auVar61._0_8_ != 0) {
              (*_xmlFree)(auVar61._0_8_);
              iVar14 = extraout_EDX_11;
            }
            call_tests = call_tests + 1;
            if (lVar40 != 0) {
              xmlFreeValidCtxt(lVar40);
              iVar14 = extraout_EDX_12;
            }
            if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc))
            {
              xmlFreeDoc(pxVar41);
              iVar14 = extraout_EDX_13;
            }
            des_xmlNodePtr(iVar53,pxVar44,iVar14);
            xmlResetLastError();
            iVar14 = xmlMemBlocks();
            if (iVar13 != iVar14) {
              iVar14 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlValidCtxtNormalizeAttributeValue",
                     (ulong)(uint)(iVar14 - iVar13));
              iVar12 = iVar12 + 1;
              printf(" %d",_test_ret_8);
              printf(" %d",(ulong)(uint)test_ret);
              printf(" %d",iVar53);
              printf(" %d",uVar38);
              printf(" %d");
              putchar(10);
              pxVar44 = pxVar50;
            }
            uVar60 = uVar60 + 1;
            pxVar50 = (xmlNodePtr)(ulong)uVar60;
            puVar49 = puVar49 + 1;
          } while (uVar60 != 5);
          uVar60 = (uint)uVar38 + 1;
          uVar38 = (ulong)uVar60;
        } while (uVar60 != 5);
        iVar53 = iVar53 + 1;
      } while (iVar53 != 3);
      test_ret = test_ret + 1;
    } while (test_ret != 4);
    _test_ret_8 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar53 = 0;
  _test_ret_4 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    pxVar41 = (xmlDocPtr)0x0;
    uVar58 = 0;
    if (bVar51) {
      uVar58 = 0x1658d8;
    }
    puVar59 = &DAT_0015fd14;
    do {
      iVar13 = xmlMemBlocks();
      pxVar45 = (xmlDocPtr)0x0;
      xmlValidGetPotentialChildren(0,0,uVar58,*puVar59);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      iVar15 = (int)pxVar41;
      if (iVar13 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidGetPotentialChildren",
               (ulong)(uint)(iVar14 - iVar13));
        iVar53 = iVar53 + 1;
        printf(" %d",0);
        printf(" %d",0);
        printf(" %d",_test_ret_4);
        printf(" %d");
        putchar(10);
        pxVar45 = pxVar41;
      }
      uVar60 = iVar15 + 1;
      pxVar41 = (xmlDocPtr)(ulong)uVar60;
      puVar59 = puVar59 + 1;
    } while (uVar60 != 4);
    _test_ret_4 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar60 = 0;
  do {
    iVar14 = 0;
    do {
      puVar59 = &DAT_0015fd14;
      pxVar41 = (xmlDocPtr)0x0;
      do {
        iVar16 = (int)pxVar45;
        iVar15 = xmlMemBlocks();
        pxVar44 = gen_xmlNodePtr(uVar60,iVar16);
        pxVar45 = (xmlDocPtr)gen_xmlNodePtr(iVar14,iVar16);
        xmlValidGetValidElements(pxVar44,pxVar45,0,*puVar59);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar60,pxVar44,nr);
        des_xmlNodePtr(iVar14,(xmlNodePtr)pxVar45,nr_00);
        xmlResetLastError();
        iVar16 = xmlMemBlocks();
        iVar17 = (int)pxVar41;
        if (iVar15 != iVar16) {
          iVar16 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidGetValidElements",
                 (ulong)(uint)(iVar16 - iVar15));
          iVar13 = iVar13 + 1;
          printf(" %d",(ulong)uVar60);
          printf(" %d",iVar14);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
          pxVar45 = pxVar41;
        }
        uVar10 = iVar17 + 1;
        pxVar41 = (xmlDocPtr)(ulong)uVar10;
        puVar59 = puVar59 + 1;
      } while (uVar10 != 4);
      iVar14 = iVar14 + 1;
    } while (iVar14 != 3);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 3);
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0;
    do {
      uVar9 = 0;
      do {
        puVar49 = &DAT_00162d68;
        pxVar41 = (xmlDocPtr)0x0;
        do {
          iVar16 = (int)pxVar45;
          iVar15 = xmlMemBlocks();
          pxVar46 = gen_xmlDocPtr(uVar60,iVar16);
          pxVar45 = (xmlDocPtr)gen_xmlNodePtr(uVar10,iVar16);
          if (uVar9 < 4) {
            uVar58 = (&DAT_00162d68)[uVar9];
          }
          else {
            uVar58 = 0;
          }
          uVar8 = (uint)pxVar41;
          if (uVar8 < 4) {
            uVar47 = *puVar49;
          }
          else {
            uVar47 = 0;
          }
          auVar61 = xmlValidNormalizeAttributeValue(pxVar46,pxVar45,uVar58,uVar47);
          iVar16 = auVar61._8_4_;
          if (auVar61._0_8_ != 0) {
            (*_xmlFree)(auVar61._0_8_);
            iVar16 = extraout_EDX_14;
          }
          call_tests = call_tests + 1;
          if (((pxVar46 != (xmlDocPtr)0x0) && (api_doc != pxVar46)) && (pxVar46->doc != api_doc)) {
            xmlFreeDoc(pxVar46);
            iVar16 = extraout_EDX_15;
          }
          des_xmlNodePtr(uVar10,(xmlNodePtr)pxVar45,iVar16);
          xmlResetLastError();
          iVar16 = xmlMemBlocks();
          if (iVar15 != iVar16) {
            iVar16 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidNormalizeAttributeValue",
                   (ulong)(uint)(iVar16 - iVar15));
            iVar14 = iVar14 + 1;
            printf(" %d",(ulong)uVar60);
            printf(" %d",(ulong)uVar10);
            printf(" %d",(ulong)uVar9);
            printf(" %d");
            putchar(10);
            pxVar45 = pxVar41;
          }
          uVar8 = uVar8 + 1;
          pxVar41 = (xmlDocPtr)(ulong)uVar8;
          puVar49 = puVar49 + 1;
        } while (uVar8 != 5);
        uVar9 = uVar9 + 1;
      } while (uVar9 != 5);
      uVar10 = uVar10 + 1;
    } while (uVar10 != 3);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 4);
  function_tests = function_tests + 1;
  iVar15 = 0;
  _test_ret_4 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    iVar16 = 0;
    do {
      iVar18 = (int)pxVar45;
      iVar17 = xmlMemBlocks();
      if (bVar51) {
        lVar40 = xmlNewValidCtxt();
      }
      else {
        lVar40 = 0;
      }
      pxVar41 = gen_xmlDocPtr(iVar16,iVar18);
      pxVar45 = pxVar41;
      xmlValidateAttributeDecl(lVar40,pxVar41,0);
      call_tests = call_tests + 1;
      if (lVar40 != 0) {
        xmlFreeValidCtxt(lVar40);
      }
      if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
        xmlFreeDoc(pxVar41);
      }
      xmlResetLastError();
      iVar18 = xmlMemBlocks();
      if (iVar17 != iVar18) {
        iVar18 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateAttributeDecl",(ulong)(uint)(iVar18 - iVar17))
        ;
        iVar15 = iVar15 + 1;
        printf(" %d",_test_ret_4);
        printf(" %d");
        pxVar45 = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      iVar16 = iVar16 + 1;
    } while (iVar16 != 4);
    _test_ret_4 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar16 = 0;
  uVar60 = 0;
  do {
    uVar10 = 0;
    puVar49 = &DAT_00162d68;
    do {
      iVar17 = xmlMemBlocks();
      uVar55 = 0;
      if (uVar60 - 1 < 3) {
        uVar55 = *(undefined4 *)(&DAT_0015221c + (ulong)(uVar60 - 1) * 4);
      }
      if (uVar10 < 4) {
        pxVar41 = (xmlDocPtr)*puVar49;
      }
      else {
        pxVar41 = (xmlDocPtr)0x0;
      }
      xmlValidateAttributeValue(uVar55);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar18 = xmlMemBlocks();
      if (iVar17 != iVar18) {
        iVar18 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateAttributeValue",(ulong)(uint)(iVar18 - iVar17)
              );
        iVar16 = iVar16 + 1;
        printf(" %d",(ulong)uVar60);
        pxVar41 = (xmlDocPtr)(ulong)uVar10;
        printf(" %d");
        putchar(10);
      }
      uVar10 = uVar10 + 1;
      puVar49 = puVar49 + 1;
    } while (uVar10 != 5);
    uVar60 = uVar60 + 1;
  } while (uVar60 != 4);
  function_tests = function_tests + 1;
  iVar17 = 0;
  uVar60 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar10 = 0;
    do {
      iVar19 = (int)pxVar41;
      iVar18 = xmlMemBlocks();
      if (bVar51) {
        lVar40 = xmlNewValidCtxt();
      }
      else {
        lVar40 = 0;
      }
      pxVar45 = gen_xmlDocPtr(uVar10,iVar19);
      pxVar41 = pxVar45;
      xmlValidateDocument(lVar40);
      call_tests = call_tests + 1;
      if (lVar40 != 0) {
        xmlFreeValidCtxt(lVar40);
      }
      if (((pxVar45 != (xmlDocPtr)0x0) && (api_doc != pxVar45)) && (pxVar45->doc != api_doc)) {
        xmlFreeDoc(pxVar45);
      }
      xmlResetLastError();
      iVar19 = xmlMemBlocks();
      if (iVar18 != iVar19) {
        iVar19 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateDocument",(ulong)(uint)(iVar19 - iVar18));
        iVar17 = iVar17 + 1;
        printf(" %d",(ulong)uVar60);
        pxVar41 = (xmlDocPtr)(ulong)uVar10;
        printf(" %d");
        putchar(10);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 4);
    uVar60 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar18 = 0;
  uVar60 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar10 = 0;
    do {
      iVar20 = (int)pxVar41;
      iVar19 = xmlMemBlocks();
      if (bVar51) {
        lVar40 = xmlNewValidCtxt();
      }
      else {
        lVar40 = 0;
      }
      pxVar45 = gen_xmlDocPtr(uVar10,iVar20);
      pxVar41 = pxVar45;
      xmlValidateDocumentFinal(lVar40);
      call_tests = call_tests + 1;
      if (lVar40 != 0) {
        xmlFreeValidCtxt(lVar40);
      }
      if (((pxVar45 != (xmlDocPtr)0x0) && (api_doc != pxVar45)) && (pxVar45->doc != api_doc)) {
        xmlFreeDoc(pxVar45);
      }
      xmlResetLastError();
      iVar20 = xmlMemBlocks();
      if (iVar19 != iVar20) {
        iVar20 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateDocumentFinal",(ulong)(uint)(iVar20 - iVar19))
        ;
        iVar18 = iVar18 + 1;
        printf(" %d",(ulong)uVar60);
        pxVar41 = (xmlDocPtr)(ulong)uVar10;
        printf(" %d");
        putchar(10);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 4);
    uVar60 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar19 = 0;
  _test_ret_5 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar60 = 0;
    do {
      pxVar45 = (xmlDocPtr)0x0;
      do {
        iVar21 = (int)pxVar41;
        iVar20 = xmlMemBlocks();
        if (bVar51) {
          lVar40 = xmlNewValidCtxt();
        }
        else {
          lVar40 = 0;
        }
        pxVar46 = gen_xmlDocPtr(uVar60,iVar21);
        iVar22 = (int)pxVar45;
        pxVar41 = (xmlDocPtr)gen_xmlDtdPtr(iVar22,iVar21);
        xmlValidateDtd(lVar40,pxVar46,pxVar41);
        call_tests = call_tests + 1;
        iVar21 = extraout_EDX_16;
        if (lVar40 != 0) {
          xmlFreeValidCtxt(lVar40);
          iVar21 = extraout_EDX_17;
        }
        if (((pxVar46 != (xmlDocPtr)0x0) && (api_doc != pxVar46)) && (pxVar46->doc != api_doc)) {
          xmlFreeDoc(pxVar46);
          iVar21 = extraout_EDX_18;
        }
        des_xmlDtdPtr(iVar22,(xmlDtdPtr)pxVar41,iVar21);
        xmlResetLastError();
        iVar21 = xmlMemBlocks();
        if (iVar20 != iVar21) {
          iVar21 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidateDtd",(ulong)(uint)(iVar21 - iVar20));
          iVar19 = iVar19 + 1;
          printf(" %d",_test_ret_5);
          printf(" %d",(ulong)uVar60);
          printf(" %d");
          putchar(10);
          pxVar41 = pxVar45;
        }
        pxVar45 = (xmlDocPtr)(ulong)(iVar22 + 1U);
      } while (iVar22 + 1U != 3);
      uVar60 = uVar60 + 1;
    } while (uVar60 != 4);
    _test_ret_5 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar20 = 0;
  uVar60 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar10 = 0;
    do {
      iVar22 = (int)pxVar41;
      iVar21 = xmlMemBlocks();
      if (bVar51) {
        lVar40 = xmlNewValidCtxt();
      }
      else {
        lVar40 = 0;
      }
      pxVar45 = gen_xmlDocPtr(uVar10,iVar22);
      pxVar41 = pxVar45;
      xmlValidateDtdFinal(lVar40);
      call_tests = call_tests + 1;
      if (lVar40 != 0) {
        xmlFreeValidCtxt(lVar40);
      }
      if (((pxVar45 != (xmlDocPtr)0x0) && (api_doc != pxVar45)) && (pxVar45->doc != api_doc)) {
        xmlFreeDoc(pxVar45);
      }
      xmlResetLastError();
      iVar22 = xmlMemBlocks();
      if (iVar21 != iVar22) {
        iVar22 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateDtdFinal",(ulong)(uint)(iVar22 - iVar21));
        iVar20 = iVar20 + 1;
        printf(" %d",(ulong)uVar60);
        pxVar41 = (xmlDocPtr)(ulong)uVar10;
        printf(" %d");
        putchar(10);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 4);
    uVar60 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar21 = 0;
  _test_ret_5 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar60 = 0;
    do {
      pxVar45 = (xmlDocPtr)0x0;
      do {
        iVar23 = (int)pxVar41;
        iVar22 = xmlMemBlocks();
        if (bVar51) {
          lVar40 = xmlNewValidCtxt();
        }
        else {
          lVar40 = 0;
        }
        pxVar46 = gen_xmlDocPtr(uVar60,iVar23);
        iVar24 = (int)pxVar45;
        pxVar41 = (xmlDocPtr)gen_xmlNodePtr(iVar24,iVar23);
        xmlValidateElement(lVar40,pxVar46,pxVar41);
        call_tests = call_tests + 1;
        iVar23 = extraout_EDX_19;
        if (lVar40 != 0) {
          xmlFreeValidCtxt(lVar40);
          iVar23 = extraout_EDX_20;
        }
        if (((pxVar46 != (xmlDocPtr)0x0) && (api_doc != pxVar46)) && (pxVar46->doc != api_doc)) {
          xmlFreeDoc(pxVar46);
          iVar23 = extraout_EDX_21;
        }
        des_xmlNodePtr(iVar24,(xmlNodePtr)pxVar41,iVar23);
        xmlResetLastError();
        iVar23 = xmlMemBlocks();
        if (iVar22 != iVar23) {
          iVar23 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidateElement",(ulong)(uint)(iVar23 - iVar22));
          iVar21 = iVar21 + 1;
          printf(" %d",_test_ret_5);
          printf(" %d",(ulong)uVar60);
          printf(" %d");
          putchar(10);
          pxVar41 = pxVar45;
        }
        pxVar45 = (xmlDocPtr)(ulong)(iVar24 + 1U);
      } while (iVar24 + 1U != 3);
      uVar60 = uVar60 + 1;
    } while (uVar60 != 4);
    _test_ret_5 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar22 = 0;
  _test_ret_4 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    iVar23 = 0;
    do {
      iVar27 = (int)pxVar41;
      iVar24 = xmlMemBlocks();
      if (bVar51) {
        lVar40 = xmlNewValidCtxt();
      }
      else {
        lVar40 = 0;
      }
      pxVar45 = gen_xmlDocPtr(iVar23,iVar27);
      pxVar41 = pxVar45;
      xmlValidateElementDecl(lVar40,pxVar45,0);
      call_tests = call_tests + 1;
      if (lVar40 != 0) {
        xmlFreeValidCtxt(lVar40);
      }
      if (((pxVar45 != (xmlDocPtr)0x0) && (api_doc != pxVar45)) && (pxVar45->doc != api_doc)) {
        xmlFreeDoc(pxVar45);
      }
      xmlResetLastError();
      iVar27 = xmlMemBlocks();
      if (iVar24 != iVar27) {
        iVar27 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateElementDecl",(ulong)(uint)(iVar27 - iVar24));
        iVar22 = iVar22 + 1;
        printf(" %d",_test_ret_4);
        printf(" %d");
        pxVar41 = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      iVar23 = iVar23 + 1;
    } while (iVar23 != 4);
    _test_ret_4 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  puVar49 = &DAT_00162d68;
  uVar60 = 0;
  iVar23 = 0;
  do {
    iVar24 = xmlMemBlocks();
    if (uVar60 < 4) {
      uVar58 = *puVar49;
    }
    else {
      uVar58 = 0;
    }
    xmlValidateNameValue(uVar58);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar27 = xmlMemBlocks();
    if (iVar24 != iVar27) {
      iVar27 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlValidateNameValue",(ulong)(uint)(iVar27 - iVar24));
      iVar23 = iVar23 + 1;
      pxVar41 = (xmlDocPtr)(ulong)uVar60;
      printf(" %d");
      putchar(10);
    }
    uVar60 = uVar60 + 1;
    puVar49 = puVar49 + 1;
  } while (uVar60 != 5);
  function_tests = function_tests + 1;
  puVar49 = &DAT_00162d68;
  uVar60 = 0;
  iVar24 = 0;
  do {
    iVar27 = xmlMemBlocks();
    if (uVar60 < 4) {
      uVar58 = *puVar49;
    }
    else {
      uVar58 = 0;
    }
    xmlValidateNamesValue(uVar58);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar28 = xmlMemBlocks();
    if (iVar27 != iVar28) {
      iVar28 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlValidateNamesValue",(ulong)(uint)(iVar28 - iVar27));
      iVar24 = iVar24 + 1;
      pxVar41 = (xmlDocPtr)(ulong)uVar60;
      printf(" %d");
      putchar(10);
    }
    uVar60 = uVar60 + 1;
    puVar49 = puVar49 + 1;
  } while (uVar60 != 5);
  function_tests = function_tests + 1;
  puVar49 = &DAT_00162d68;
  uVar60 = 0;
  iVar27 = 0;
  do {
    iVar28 = xmlMemBlocks();
    if (uVar60 < 4) {
      uVar58 = *puVar49;
    }
    else {
      uVar58 = 0;
    }
    xmlValidateNmtokenValue(uVar58);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar29 = xmlMemBlocks();
    if (iVar28 != iVar29) {
      iVar29 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlValidateNmtokenValue",(ulong)(uint)(iVar29 - iVar28));
      iVar27 = iVar27 + 1;
      pxVar41 = (xmlDocPtr)(ulong)uVar60;
      printf(" %d");
      putchar(10);
    }
    uVar60 = uVar60 + 1;
    puVar49 = puVar49 + 1;
  } while (uVar60 != 5);
  function_tests = function_tests + 1;
  puVar49 = &DAT_00162d68;
  uVar60 = 0;
  iVar28 = 0;
  do {
    iVar29 = xmlMemBlocks();
    if (uVar60 < 4) {
      uVar58 = *puVar49;
    }
    else {
      uVar58 = 0;
    }
    xmlValidateNmtokensValue(uVar58);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar30 = xmlMemBlocks();
    if (iVar29 != iVar30) {
      iVar30 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlValidateNmtokensValue",(ulong)(uint)(iVar30 - iVar29));
      iVar28 = iVar28 + 1;
      pxVar41 = (xmlDocPtr)(ulong)uVar60;
      printf(" %d");
      putchar(10);
    }
    uVar60 = uVar60 + 1;
    puVar49 = puVar49 + 1;
  } while (uVar60 != 5);
  function_tests = function_tests + 1;
  iVar29 = 0;
  _test_ret_4 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    iVar30 = 0;
    do {
      iVar32 = (int)pxVar41;
      iVar31 = xmlMemBlocks();
      if (bVar51) {
        lVar40 = xmlNewValidCtxt();
      }
      else {
        lVar40 = 0;
      }
      pxVar45 = gen_xmlDocPtr(iVar30,iVar32);
      pxVar41 = pxVar45;
      xmlValidateNotationDecl(lVar40,pxVar45,0);
      call_tests = call_tests + 1;
      if (lVar40 != 0) {
        xmlFreeValidCtxt(lVar40);
      }
      if (((pxVar45 != (xmlDocPtr)0x0) && (api_doc != pxVar45)) && (pxVar45->doc != api_doc)) {
        xmlFreeDoc(pxVar45);
      }
      xmlResetLastError();
      iVar32 = xmlMemBlocks();
      if (iVar31 != iVar32) {
        iVar32 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlValidateNotationDecl",(ulong)(uint)(iVar32 - iVar31));
        iVar29 = iVar29 + 1;
        printf(" %d",_test_ret_4);
        printf(" %d");
        pxVar41 = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      iVar30 = iVar30 + 1;
    } while (iVar30 != 4);
    _test_ret_4 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar30 = 0;
  _test_ret_5 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar60 = 0;
    do {
      puVar49 = &DAT_00162d68;
      pxVar45 = (xmlDocPtr)0x0;
      do {
        iVar32 = (int)pxVar41;
        iVar31 = xmlMemBlocks();
        if (bVar51) {
          lVar40 = xmlNewValidCtxt();
        }
        else {
          lVar40 = 0;
        }
        pxVar46 = gen_xmlDocPtr(uVar60,iVar32);
        uVar10 = (uint)pxVar45;
        if (uVar10 < 4) {
          uVar58 = *puVar49;
        }
        else {
          uVar58 = 0;
        }
        pxVar41 = pxVar46;
        xmlValidateNotationUse(lVar40,pxVar46,uVar58);
        call_tests = call_tests + 1;
        if (lVar40 != 0) {
          xmlFreeValidCtxt(lVar40);
        }
        if (((pxVar46 != (xmlDocPtr)0x0) && (api_doc != pxVar46)) && (pxVar46->doc != api_doc)) {
          xmlFreeDoc(pxVar46);
        }
        xmlResetLastError();
        iVar32 = xmlMemBlocks();
        if (iVar31 != iVar32) {
          iVar32 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidateNotationUse",(ulong)(uint)(iVar32 - iVar31))
          ;
          iVar30 = iVar30 + 1;
          printf(" %d",_test_ret_5);
          printf(" %d",(ulong)uVar60);
          printf(" %d");
          putchar(10);
          pxVar41 = pxVar45;
        }
        uVar10 = uVar10 + 1;
        pxVar45 = (xmlDocPtr)(ulong)uVar10;
        puVar49 = puVar49 + 1;
      } while (uVar10 != 5);
      uVar60 = uVar60 + 1;
    } while (uVar60 != 4);
    _test_ret_5 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  test_ret_37 = 0;
  _test_ret_11 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar60 = 0;
    do {
      uVar10 = 0;
      do {
        uVar9 = 0;
        bVar2 = true;
        do {
          bVar1 = bVar2;
          puVar49 = &DAT_00162d68;
          pxVar45 = (xmlDocPtr)0x0;
          do {
            iVar32 = (int)pxVar41;
            iVar31 = xmlMemBlocks();
            if (bVar51) {
              lVar40 = xmlNewValidCtxt();
            }
            else {
              lVar40 = 0;
            }
            pxVar46 = gen_xmlDocPtr(uVar60,iVar32);
            pxVar41 = (xmlDocPtr)gen_xmlNodePtr(uVar10,iVar32);
            pxVar43 = gen_xmlAttrPtr(uVar9,iVar32);
            uVar8 = (uint)pxVar45;
            if (uVar8 < 4) {
              uVar58 = *puVar49;
            }
            else {
              uVar58 = 0;
            }
            xmlValidateOneAttribute(lVar40,pxVar46,pxVar41,pxVar43,uVar58);
            call_tests = call_tests + 1;
            iVar32 = extraout_EDX_22;
            if (lVar40 != 0) {
              xmlFreeValidCtxt(lVar40);
              iVar32 = extraout_EDX_23;
            }
            if (((pxVar46 != (xmlDocPtr)0x0) && (api_doc != pxVar46)) && (pxVar46->doc != api_doc))
            {
              xmlFreeDoc(pxVar46);
              iVar32 = extraout_EDX_24;
            }
            des_xmlNodePtr(uVar10,(xmlNodePtr)pxVar41,iVar32);
            if (bVar1) {
              xmlFreeDoc(api_doc);
              api_doc = (xmlDocPtr)0x0;
              api_dtd = (xmlDtdPtr)0x0;
              api_root = (xmlNodePtr)0x0;
              api_ns = (xmlNsPtr)0x0;
            }
            xmlResetLastError();
            iVar32 = xmlMemBlocks();
            if (iVar31 != iVar32) {
              iVar32 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlValidateOneAttribute",
                     (ulong)(uint)(iVar32 - iVar31));
              test_ret_37 = test_ret_37 + 1;
              printf(" %d",_test_ret_11);
              printf(" %d",(ulong)uVar60);
              printf(" %d",(ulong)uVar10);
              printf(" %d",(ulong)uVar9);
              printf(" %d");
              putchar(10);
              pxVar41 = pxVar45;
            }
            uVar8 = uVar8 + 1;
            pxVar45 = (xmlDocPtr)(ulong)uVar8;
            puVar49 = puVar49 + 1;
          } while (uVar8 != 5);
          uVar9 = 1;
          bVar2 = false;
        } while (bVar1);
        uVar10 = uVar10 + 1;
      } while (uVar10 != 3);
      uVar60 = uVar60 + 1;
    } while (uVar60 != 4);
    _test_ret_11 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  test_ret_38 = 0;
  _test_ret_5 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar60 = 0;
    do {
      pxVar45 = (xmlDocPtr)0x0;
      do {
        iVar32 = (int)pxVar41;
        iVar31 = xmlMemBlocks();
        if (bVar51) {
          lVar40 = xmlNewValidCtxt();
        }
        else {
          lVar40 = 0;
        }
        pxVar46 = gen_xmlDocPtr(uVar60,iVar32);
        iVar33 = (int)pxVar45;
        pxVar41 = (xmlDocPtr)gen_xmlNodePtr(iVar33,iVar32);
        xmlValidateOneElement(lVar40,pxVar46,pxVar41);
        call_tests = call_tests + 1;
        iVar32 = extraout_EDX_25;
        if (lVar40 != 0) {
          xmlFreeValidCtxt(lVar40);
          iVar32 = extraout_EDX_26;
        }
        if (((pxVar46 != (xmlDocPtr)0x0) && (api_doc != pxVar46)) && (pxVar46->doc != api_doc)) {
          xmlFreeDoc(pxVar46);
          iVar32 = extraout_EDX_27;
        }
        des_xmlNodePtr(iVar33,(xmlNodePtr)pxVar41,iVar32);
        xmlResetLastError();
        iVar32 = xmlMemBlocks();
        if (iVar31 != iVar32) {
          iVar32 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidateOneElement",(ulong)(uint)(iVar32 - iVar31));
          test_ret_38 = test_ret_38 + 1;
          printf(" %d",_test_ret_5);
          printf(" %d",(ulong)uVar60);
          printf(" %d");
          putchar(10);
          pxVar41 = pxVar45;
        }
        pxVar45 = (xmlDocPtr)(ulong)(iVar33 + 1U);
      } while (iVar33 + 1U != 3);
      uVar60 = uVar60 + 1;
    } while (uVar60 != 4);
    _test_ret_5 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar31 = 0;
  local_38 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar60 = 0;
    do {
      iVar32 = 0;
      do {
        uVar10 = 0;
        do {
          _test_ret_16 = 0;
          bVar2 = true;
          do {
            bVar1 = bVar2;
            pxVar45 = (xmlDocPtr)0x0;
            puVar49 = &DAT_00162d68;
            do {
              iVar34 = (int)pxVar41;
              iVar33 = xmlMemBlocks();
              if (bVar51) {
                lVar40 = xmlNewValidCtxt();
              }
              else {
                lVar40 = 0;
              }
              pxVar46 = gen_xmlDocPtr(uVar60,iVar34);
              pxVar41 = (xmlDocPtr)gen_xmlNodePtr(iVar32,iVar34);
              if (uVar10 < 4) {
                uVar58 = (&DAT_00162d68)[uVar10];
              }
              else {
                uVar58 = 0;
              }
              if (bVar1) {
                get_api_root();
                pxVar54 = api_ns;
                if (api_root != (xmlNodePtr)0x0) {
                  api_ns = api_root->nsDef;
                  pxVar54 = api_ns;
                }
              }
              else {
                pxVar54 = (xmlNs *)0x0;
              }
              uVar9 = (uint)pxVar45;
              if (uVar9 < 4) {
                uVar47 = *puVar49;
              }
              else {
                uVar47 = 0;
              }
              xmlValidateOneNamespace(lVar40,pxVar46,pxVar41,uVar58,pxVar54,uVar47);
              call_tests = call_tests + 1;
              iVar34 = extraout_EDX_28;
              if (lVar40 != 0) {
                xmlFreeValidCtxt(lVar40);
                iVar34 = extraout_EDX_29;
              }
              if (((pxVar46 != (xmlDocPtr)0x0) && (api_doc != pxVar46)) && (pxVar46->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar46);
                iVar34 = extraout_EDX_30;
              }
              des_xmlNodePtr(iVar32,(xmlNodePtr)pxVar41,iVar34);
              if (bVar1) {
                xmlFreeDoc(api_doc);
                api_doc = (xmlDocPtr)0x0;
                api_dtd = (xmlDtdPtr)0x0;
                api_root = (xmlNodePtr)0x0;
                api_ns = (xmlNsPtr)0x0;
              }
              xmlResetLastError();
              iVar34 = xmlMemBlocks();
              if (iVar33 != iVar34) {
                iVar34 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlValidateOneNamespace",
                       (ulong)(uint)(iVar34 - iVar33));
                iVar31 = iVar31 + 1;
                printf(" %d",(ulong)local_38);
                printf(" %d",(ulong)uVar60);
                printf(" %d",iVar32);
                printf(" %d",(ulong)uVar10);
                printf(" %d",_test_ret_16);
                printf(" %d");
                putchar(10);
                pxVar41 = pxVar45;
              }
              uVar9 = uVar9 + 1;
              pxVar45 = (xmlDocPtr)(ulong)uVar9;
              puVar49 = puVar49 + 1;
            } while (uVar9 != 5);
            _test_ret_16 = 1;
            bVar2 = false;
          } while (bVar1);
          uVar10 = uVar10 + 1;
        } while (uVar10 != 5);
        iVar32 = iVar32 + 1;
      } while (iVar32 != 3);
      uVar60 = uVar60 + 1;
    } while (uVar60 != 4);
    local_38 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  iVar32 = 0;
  _test_ret_7 = 0;
  bVar2 = true;
  do {
    bVar51 = bVar2;
    uVar60 = 0;
    do {
      uVar38 = 0;
      do {
        pxVar45 = (xmlDocPtr)0x0;
        puVar49 = &DAT_00162d68;
        do {
          iVar34 = (int)pxVar41;
          iVar33 = xmlMemBlocks();
          if (bVar51) {
            lVar40 = xmlNewValidCtxt();
          }
          else {
            lVar40 = 0;
          }
          pxVar46 = gen_xmlDocPtr(uVar60,iVar34);
          iVar35 = (int)uVar38;
          pxVar41 = (xmlDocPtr)gen_xmlNodePtr(iVar35,iVar34);
          uVar10 = (uint)pxVar45;
          if (uVar10 < 4) {
            uVar58 = *puVar49;
          }
          else {
            uVar58 = 0;
          }
          xmlValidatePopElement(lVar40,pxVar46,pxVar41,uVar58);
          call_tests = call_tests + 1;
          iVar34 = extraout_EDX_31;
          if (lVar40 != 0) {
            xmlFreeValidCtxt(lVar40);
            iVar34 = extraout_EDX_32;
          }
          if (((pxVar46 != (xmlDocPtr)0x0) && (api_doc != pxVar46)) && (pxVar46->doc != api_doc)) {
            xmlFreeDoc(pxVar46);
            iVar34 = extraout_EDX_33;
          }
          des_xmlNodePtr(iVar35,(xmlNodePtr)pxVar41,iVar34);
          xmlResetLastError();
          iVar34 = xmlMemBlocks();
          if (iVar33 != iVar34) {
            iVar34 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidatePopElement",(ulong)(uint)(iVar34 - iVar33)
                  );
            iVar32 = iVar32 + 1;
            printf(" %d",_test_ret_7);
            printf(" %d",(ulong)uVar60);
            printf(" %d",uVar38);
            printf(" %d");
            putchar(10);
            pxVar41 = pxVar45;
          }
          uVar10 = uVar10 + 1;
          pxVar45 = (xmlDocPtr)(ulong)uVar10;
          puVar49 = puVar49 + 1;
        } while (uVar10 != 5);
        uVar38 = (ulong)(iVar35 + 1U);
      } while (iVar35 + 1U != 3);
      uVar60 = uVar60 + 1;
    } while (uVar60 != 4);
    _test_ret_7 = 1;
    bVar2 = false;
  } while (bVar51);
  function_tests = function_tests + 1;
  bVar2 = true;
  iVar33 = 0;
  _test_ret_7 = 0;
  do {
    uVar38 = 0;
    do {
      puVar59 = &DAT_0015fd14;
      pxVar41 = (xmlDocPtr)0x0;
      do {
        iVar34 = xmlMemBlocks();
        if (bVar2) {
          lVar40 = xmlNewValidCtxt();
        }
        else {
          lVar40 = 0;
        }
        if ((uint)uVar38 < 4) {
          iVar5 = (*(code *)(&DAT_00152118 + *(int *)(&DAT_00152118 + uVar38 * 4)))();
          return iVar5;
        }
        pxVar45 = (xmlDocPtr)0x0;
        iVar35 = (int)pxVar41;
        xmlValidatePushCData(lVar40,0,*puVar59);
        call_tests = call_tests + 1;
        if (lVar40 != 0) {
          xmlFreeValidCtxt(lVar40);
        }
        xmlResetLastError();
        iVar36 = xmlMemBlocks();
        if (iVar34 != iVar36) {
          iVar36 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlValidatePushCData",(ulong)(uint)(iVar36 - iVar34));
          iVar33 = iVar33 + 1;
          printf(" %d",_test_ret_7);
          printf(" %d",uVar38);
          printf(" %d");
          putchar(10);
          pxVar45 = pxVar41;
        }
        uVar60 = iVar35 + 1;
        pxVar41 = (xmlDocPtr)(ulong)uVar60;
        puVar59 = puVar59 + 1;
      } while (uVar60 != 4);
      uVar60 = (uint)uVar38 + 1;
      uVar38 = (ulong)uVar60;
    } while (uVar60 != 5);
    _test_ret_7 = 1;
    bVar51 = !bVar2;
    bVar2 = false;
    if (bVar51) {
      function_tests = function_tests + 1;
      iVar34 = 0;
      _test_ret_7 = 0;
      bVar2 = true;
      do {
        bVar51 = bVar2;
        uVar60 = 0;
        do {
          uVar38 = 0;
          do {
            pxVar41 = (xmlDocPtr)0x0;
            puVar49 = &DAT_00162d68;
            do {
              iVar36 = (int)pxVar45;
              iVar35 = xmlMemBlocks();
              if (bVar51) {
                lVar40 = xmlNewValidCtxt();
              }
              else {
                lVar40 = 0;
              }
              pxVar46 = gen_xmlDocPtr(uVar60,iVar36);
              iVar37 = (int)uVar38;
              pxVar45 = (xmlDocPtr)gen_xmlNodePtr(iVar37,iVar36);
              uVar10 = (uint)pxVar41;
              if (uVar10 < 4) {
                uVar58 = *puVar49;
              }
              else {
                uVar58 = 0;
              }
              xmlValidatePushElement(lVar40,pxVar46,pxVar45,uVar58);
              call_tests = call_tests + 1;
              iVar36 = extraout_EDX_34;
              if (lVar40 != 0) {
                xmlFreeValidCtxt(lVar40);
                iVar36 = extraout_EDX_35;
              }
              if (((pxVar46 != (xmlDocPtr)0x0) && (api_doc != pxVar46)) && (pxVar46->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar46);
                iVar36 = extraout_EDX_36;
              }
              des_xmlNodePtr(iVar37,(xmlNodePtr)pxVar45,iVar36);
              xmlResetLastError();
              iVar36 = xmlMemBlocks();
              if (iVar35 != iVar36) {
                iVar36 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlValidatePushElement",
                       (ulong)(uint)(iVar36 - iVar35));
                iVar34 = iVar34 + 1;
                printf(" %d",_test_ret_7);
                printf(" %d",(ulong)uVar60);
                printf(" %d",uVar38);
                printf(" %d");
                putchar(10);
                pxVar45 = pxVar41;
              }
              uVar10 = uVar10 + 1;
              pxVar41 = (xmlDocPtr)(ulong)uVar10;
              puVar49 = puVar49 + 1;
            } while (uVar10 != 5);
            uVar38 = (ulong)(iVar37 + 1U);
          } while (iVar37 + 1U != 3);
          uVar60 = uVar60 + 1;
        } while (uVar60 != 4);
        _test_ret_7 = 1;
        bVar2 = false;
      } while (bVar51);
      function_tests = function_tests + 1;
      iVar35 = 0;
      _test_ret_4 = 0;
      bVar2 = true;
      do {
        bVar51 = bVar2;
        uVar60 = 0;
        do {
          iVar37 = (int)pxVar45;
          iVar36 = xmlMemBlocks();
          if (bVar51) {
            lVar40 = xmlNewValidCtxt();
          }
          else {
            lVar40 = 0;
          }
          pxVar41 = gen_xmlDocPtr(uVar60,iVar37);
          pxVar45 = pxVar41;
          xmlValidateRoot(lVar40);
          call_tests = call_tests + 1;
          if (lVar40 != 0) {
            xmlFreeValidCtxt(lVar40);
          }
          if (((pxVar41 != (xmlDocPtr)0x0) && (api_doc != pxVar41)) && (pxVar41->doc != api_doc)) {
            xmlFreeDoc(pxVar41);
          }
          xmlResetLastError();
          iVar37 = xmlMemBlocks();
          if (iVar36 != iVar37) {
            iVar37 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidateRoot",(ulong)(uint)(iVar37 - iVar36));
            iVar35 = iVar35 + 1;
            printf(" %d",_test_ret_4);
            pxVar45 = (xmlDocPtr)(ulong)uVar60;
            printf(" %d");
            putchar(10);
          }
          uVar60 = uVar60 + 1;
        } while (uVar60 != 4);
        _test_ret_4 = 1;
        bVar2 = false;
      } while (bVar51);
      function_tests = function_tests + 1;
      uVar60 = iVar31 + iVar32 +
               test_ret_19 + iVar12 + iVar26 + iVar5 + iVar25 + iVar7 + iVar11 + iVar53 + iVar13 +
               iVar14 + iVar15 + iVar16 + iVar17 + iVar18 + iVar19 + iVar20 + iVar21 + iVar22 +
               iVar23 + iVar24 + iVar27 + iVar28 + iVar29 + iVar30 + test_ret_37 + test_ret_38 +
               iVar33 + iVar34 + iVar35;
      if (uVar60 != 0) {
        printf("Module valid: %d errors\n",(ulong)uVar60);
      }
      return uVar60;
    }
  } while( true );
}

Assistant:

static int
test_valid(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing valid : 50 of 70 functions ...\n");
    test_ret += test_xmlAddAttributeDecl();
    test_ret += test_xmlAddElementDecl();
    test_ret += test_xmlAddID();
    test_ret += test_xmlAddNotationDecl();
    test_ret += test_xmlAddRef();
    test_ret += test_xmlCopyAttributeTable();
    test_ret += test_xmlCopyDocElementContent();
    test_ret += test_xmlCopyElementContent();
    test_ret += test_xmlCopyElementTable();
    test_ret += test_xmlCopyEnumeration();
    test_ret += test_xmlCopyNotationTable();
    test_ret += test_xmlCreateEnumeration();
    test_ret += test_xmlDumpAttributeDecl();
    test_ret += test_xmlDumpAttributeTable();
    test_ret += test_xmlDumpElementDecl();
    test_ret += test_xmlDumpElementTable();
    test_ret += test_xmlDumpNotationDecl();
    test_ret += test_xmlDumpNotationTable();
    test_ret += test_xmlGetDtdAttrDesc();
    test_ret += test_xmlGetDtdElementDesc();
    test_ret += test_xmlGetDtdNotationDesc();
    test_ret += test_xmlGetDtdQAttrDesc();
    test_ret += test_xmlGetDtdQElementDesc();
    test_ret += test_xmlGetID();
    test_ret += test_xmlGetRefs();
    test_ret += test_xmlIsID();
    test_ret += test_xmlIsMixedElement();
    test_ret += test_xmlIsRef();
    test_ret += test_xmlNewDocElementContent();
    test_ret += test_xmlNewElementContent();
    test_ret += test_xmlNewValidCtxt();
    test_ret += test_xmlRemoveID();
    test_ret += test_xmlRemoveRef();
    test_ret += test_xmlSnprintfElementContent();
    test_ret += test_xmlSprintfElementContent();
    test_ret += test_xmlValidBuildContentModel();
    test_ret += test_xmlValidCtxtNormalizeAttributeValue();
    test_ret += test_xmlValidGetPotentialChildren();
    test_ret += test_xmlValidGetValidElements();
    test_ret += test_xmlValidNormalizeAttributeValue();
    test_ret += test_xmlValidateAttributeDecl();
    test_ret += test_xmlValidateAttributeValue();
    test_ret += test_xmlValidateDocument();
    test_ret += test_xmlValidateDocumentFinal();
    test_ret += test_xmlValidateDtd();
    test_ret += test_xmlValidateDtdFinal();
    test_ret += test_xmlValidateElement();
    test_ret += test_xmlValidateElementDecl();
    test_ret += test_xmlValidateNameValue();
    test_ret += test_xmlValidateNamesValue();
    test_ret += test_xmlValidateNmtokenValue();
    test_ret += test_xmlValidateNmtokensValue();
    test_ret += test_xmlValidateNotationDecl();
    test_ret += test_xmlValidateNotationUse();
    test_ret += test_xmlValidateOneAttribute();
    test_ret += test_xmlValidateOneElement();
    test_ret += test_xmlValidateOneNamespace();
    test_ret += test_xmlValidatePopElement();
    test_ret += test_xmlValidatePushCData();
    test_ret += test_xmlValidatePushElement();
    test_ret += test_xmlValidateRoot();

    if (test_ret != 0)
	printf("Module valid: %d errors\n", test_ret);
    return(test_ret);
}